

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *from,
          VerySimpleReadOnlyString *to,bool includeFind)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  byte in_R8B;
  VerySimpleReadOnlyString VVar4;
  int local_7c;
  int local_78;
  int local_74;
  uint local_64;
  char *local_58;
  uint toPos;
  uint fromPos;
  bool includeFind_local;
  VerySimpleReadOnlyString *to_local;
  VerySimpleReadOnlyString *from_local;
  VerySimpleReadOnlyString *this_local;
  
  bVar1 = in_R8B & 1;
  uVar2 = Find(from,to,0);
  uVar3 = Find(from,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000009,includeFind),
               uVar2 + to->length);
  if (uVar2 < (uint)from->length) {
    local_64 = uVar2;
    if (bVar1 == 0) {
      local_64 = uVar2 + to->length;
    }
    local_58 = from->data + local_64;
  }
  else {
    local_58 = "";
  }
  if (uVar3 < (uint)from->length) {
    if (bVar1 == 0) {
      local_74 = (uVar3 - uVar2) - to->length;
    }
    else {
      local_74 = (uVar3 + ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000009,includeFind))->
                          length) - uVar2;
    }
    local_78 = local_74;
  }
  else {
    if (bVar1 == 0) {
      local_7c = 0;
    }
    else {
      local_7c = from->length - uVar2;
    }
    local_78 = local_7c;
  }
  VerySimpleReadOnlyString(this,local_58,local_78);
  VVar4._8_8_ = extraout_RDX;
  VVar4.data = (tCharPtr)this;
  return VVar4;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromTo(const VerySimpleReadOnlyString & from, const VerySimpleReadOnlyString & to, const bool includeFind) const
	{
	    const unsigned int fromPos = Find(from);
	    const unsigned int toPos = Find(to, fromPos + from.length);
	    return VerySimpleReadOnlyString(fromPos >= (unsigned int)length ? "" : &data[includeFind ? fromPos : fromPos + (unsigned int)from.length],
	                                    toPos < (unsigned int)length ? (includeFind ? toPos + (unsigned int)to.length - fromPos : toPos - fromPos - (unsigned int)from.length)
	                                       // If the "to" needle was not found, either we return the whole string (includeFind) or an empty string
	                                       : (includeFind ? (unsigned int)length - fromPos : 0));
	}